

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

bool __thiscall GF2::VSubst<8UL>::IsId(VSubst<8UL> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[0]._words[0] != 0) {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0xff) break;
    uVar1 = uVar2 + 1;
  } while (uVar2 + 1 ==
           (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar2 + 1]._words[0]);
  return 0xfe < uVar2;
}

Assistant:

bool operator==(word wRight) const
	{	
		if (_words[0] != wRight)
			return false;
		for (size_t pos = 1; pos < _wcount; ++pos)
			if (_words[pos] != 0)
				return false;
		return true;
	}